

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::LogTest_ReadError_Test::TestBody(LogTest_ReadError_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  undefined8 *local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"foo","");
  LogTest::Write(&this->super_LogTest,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_LogTest).source_.force_error_ = true;
  LogTest::Read_abi_cxx11_(&local_50,&this->super_LogTest);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_70,"\"EOF\"","Read()",(char (*) [4])"EOF",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x171,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_70._M_string_length !=
        (undefined8 *)(local_70._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_70._M_string_length);
    }
    operator_delete((void *)local_70._M_string_length);
  }
  if ((char)local_70._M_dataplus._M_p != '\0') {
    local_70._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_50,"kBlockSize","DroppedBytes()",&kBlockSize,
               (unsigned_long *)&local_70);
    cVar2 = (char)local_50._M_dataplus._M_p;
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                 ,0x172,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
    }
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_50._M_string_length !=
          (undefined8 *)(local_50._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_50._M_string_length);
      }
      operator_delete((void *)local_50._M_string_length);
    }
    if (cVar2 != '\0') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"read error","");
      LogTest::MatchError(&local_50,&this->super_LogTest,&local_70);
      testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                ((internal *)&local_80,"\"OK\"","MatchError(\"read error\")",(char (*) [3])"OK",
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_80.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_78 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_78;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
                   ,0x173,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
        }
      }
      if (local_78 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_78 != local_78 + 2) {
          operator_delete((undefined8 *)*local_78);
        }
        operator_delete(local_78);
      }
    }
  }
  return;
}

Assistant:

TEST_F(LogTest, ReadError) {
  Write("foo");
  ForceError();
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(kBlockSize, DroppedBytes());
  ASSERT_EQ("OK", MatchError("read error"));
}